

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O0

void van_kampen::utility::
     print<int_const&,char_const(&)[3],int,char_const(&)[38],std::__cxx11::string_const&,char_const(&)[13],int,char_const(&)[4]>
               (ostream *os,int *args,char (*args_1) [3],int *args_2,char (*args_3) [38],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               char (*args_5) [13],int *args_6,char (*args_7) [4])

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_4;
  char (*args_local_3) [38];
  int *args_local_2;
  char (*args_local_1) [3];
  int *args_local;
  ostream *os_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,*args);
  poVar1 = std::operator<<(poVar1,*args_1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*args_2);
  poVar1 = std::operator<<(poVar1,*args_3);
  poVar1 = std::operator<<(poVar1,(string *)args_4);
  poVar1 = std::operator<<(poVar1,*args_5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*args_6);
  std::operator<<(poVar1,*args_7);
  std::ostream::flush();
  return;
}

Assistant:

void print(std::ostream &os, ToPrint &&... args)
        {
            (os << ... << args);
            os.flush();
        }